

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void * sqlite3WhereMalloc(WhereInfo *pWInfo,u64 nByte)

{
  u64 in_RSI;
  sqlite3 *in_RDI;
  WhereMemBlock *pBlock;
  undefined8 *local_18;
  
  local_18 = (undefined8 *)sqlite3DbMallocRawNN(in_RDI,in_RSI);
  if (local_18 != (undefined8 *)0x0) {
    *local_18 = *(undefined8 *)&in_RDI->errMask;
    local_18[1] = in_RSI;
    *(undefined8 **)&in_RDI->errMask = local_18;
    local_18 = local_18 + 2;
  }
  return local_18;
}

Assistant:

SQLITE_PRIVATE void *sqlite3WhereMalloc(WhereInfo *pWInfo, u64 nByte){
  WhereMemBlock *pBlock;
  pBlock = sqlite3DbMallocRawNN(pWInfo->pParse->db, nByte+sizeof(*pBlock));
  if( pBlock ){
    pBlock->pNext = pWInfo->pMemToFree;
    pBlock->sz = nByte;
    pWInfo->pMemToFree = pBlock;
    pBlock++;
  }
  return (void*)pBlock;
}